

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2>::Read
          (NLReader<mp::internal::TextReader<fmt::Locale>,_TestNLHandler2> *this,
          TextReader<fmt::Locale> *bound_reader)

{
  char cVar1;
  NLHeader *pNVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  TextReader<fmt::Locale> *this_00;
  bool bVar6;
  
  bVar6 = bound_reader == (TextReader<fmt::Locale> *)0x0;
  pNVar2 = this->header_;
  this->num_vars_and_exprs_ =
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_objs +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both +
       (pNVar2->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
LAB_00182a95:
  this_00 = this->reader_;
  pcVar3 = (this_00->super_ReaderBase).ptr_;
  (this_00->super_ReaderBase).token_ = pcVar3;
  (this_00->super_ReaderBase).ptr_ = pcVar3 + 1;
  cVar1 = *pcVar3;
  switch(cVar1) {
  case 'C':
    ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_algebraic_cons);
    break;
  case 'D':
  case 'E':
  case 'H':
  case 'I':
  case 'M':
  case 'N':
  case 'P':
  case 'Q':
  case 'R':
  case 'T':
  case 'U':
switchD_00182ab9_caseD_44:
    TextReader<fmt::Locale>::ReportError<>(this_00,(CStringRef)0x21937a);
    goto LAB_00182a95;
  case 'F':
    ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs);
    uVar5 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
    if (1 < uVar5) {
      TextReader<fmt::Locale>::ReportError<>(this->reader_,(CStringRef)0x2188b3);
    }
    TextReader<fmt::Locale>::ReadInt<int>(this->reader_);
    TextReader<fmt::Locale>::ReadName(this->reader_);
    TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
    goto LAB_00182a95;
  case 'G':
    NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::
    ReadLinearExpr<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::ObjHandler>
              ((NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2> *)this);
    goto LAB_00182a95;
  case 'J':
    NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::
    ReadLinearExpr<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::AlgebraicConHandler>
              ((NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2> *)this);
    goto LAB_00182a95;
  case 'K':
    ReadColumnSizes<false>(this);
    goto LAB_00182a95;
  case 'L':
    ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_logical_cons);
    TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
    ReadLogicalExpr(this);
    goto LAB_00182a95;
  case 'O':
    ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_objs);
    TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
    break;
  case 'S':
    uVar5 = TextReader<fmt::Locale>::ReadUInt<int>(this_00);
    if (7 < (int)uVar5) {
      TextReader<fmt::Locale>::ReportError<>(this->reader_,(CStringRef)0x218fee);
    }
    switch(uVar5 & 3) {
    case 0:
      NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::
      ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::VarHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2> *)this,uVar5);
      break;
    case 1:
      NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::
      ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::ConHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2> *)this,uVar5);
      break;
    case 2:
      NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::
      ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::ObjHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2> *)this,uVar5);
      break;
    case 3:
      NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::
      ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::ProblemHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2> *)this,uVar5);
    }
    goto LAB_00182a95;
  case 'V':
    ReadUInt(this,(this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars,
             this->num_vars_and_exprs_);
    iVar4 = TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
    TextReader<fmt::Locale>::ReadUInt<int>(this->reader_);
    TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
    if (iVar4 != 0) {
      ReadLinearExpr<TestNLHandler2::LinearExprHandler>(this);
    }
    ReadNumericExpr(this,false);
    goto LAB_00182a95;
  default:
    if (cVar1 == '\0') {
      if ((this_00->super_ReaderBase).end_ == pcVar3) {
        if (!bVar6) {
          return;
        }
        TextReader<fmt::Locale>::ReportError<>(this_00,(CStringRef)0x215353);
        return;
      }
      goto switchD_00182ab9_caseD_44;
    }
    if (cVar1 == 'b') {
      if (bVar6) {
        NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::
        ReadBounds<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::VarHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2> *)this);
        bVar6 = false;
        if ((this->flags_ & 1) != 0) {
          return;
        }
      }
      else {
        if (bound_reader == (TextReader<fmt::Locale> *)0x0) {
          TextReader<fmt::Locale>::ReportError<>(this_00,(CStringRef)0x21547f);
          this_00 = this->reader_;
        }
        TextReader<fmt::Locale>::operator=(this_00,bound_reader);
        bound_reader = (TextReader<fmt::Locale> *)0x0;
      }
    }
    else if (cVar1 == 'd') {
      NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::
      ReadInitialValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::AlgebraicConHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2> *)this);
    }
    else if (cVar1 == 'k') {
      ReadColumnSizes<true>(this);
    }
    else if (cVar1 == 'r') {
      NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::
      ReadBounds<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::AlgebraicConHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2> *)this);
    }
    else {
      if (cVar1 != 'x') goto switchD_00182ab9_caseD_44;
      NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::
      ReadInitialValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2>::VarHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,TestNLHandler2> *)this);
    }
    goto LAB_00182a95;
  }
  TextReader<fmt::Locale>::ReadTillEndOfLine(this->reader_);
  ReadNumericExpr(this,true);
  goto LAB_00182a95;
}

Assistant:

void NLReader<Reader, Handler>::Read(Reader *bound_reader) {
  bool read_bounds = bound_reader == 0;
  // TextReader::ReadHeader checks that this doesn't overflow.
  num_vars_and_exprs_ = header_.num_vars +
      header_.num_common_exprs_in_both +
      header_.num_common_exprs_in_cons +
      header_.num_common_exprs_in_objs +
      header_.num_common_exprs_in_single_cons +
      header_.num_common_exprs_in_single_objs;
  for (;;) {
    char c = reader_.ReadChar();
    switch (c) {
    case 'C': {
      // Nonlinear part of an algebraic constraint body.
      int index = ReadUInt(header_.num_algebraic_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnAlgebraicCon(index, ReadNumericExpr(true));
      break;
    }
    case 'L': {
      // Logical constraint expression.
      int index = ReadUInt(header_.num_logical_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnLogicalCon(index, ReadLogicalExpr());
      break;
    }
    case 'O': {
      // Objective type and nonlinear part of an objective expression.
      int index = ReadUInt(header_.num_objs);
      int obj_type = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      NumericExpr expr = ReadNumericExpr(true);
      if (handler_.NeedObj(index))
        handler_.OnObj(handler_.resulting_obj_index(index),
                       obj_type != 0 ? obj::MAX : obj::MIN,
                       expr);
      break;
    }
    case 'V': {
      // Defined variable definition (must precede V, C, L, O segments
      // where used).
      int expr_index = ReadUInt(header_.num_vars, num_vars_and_exprs_);
      expr_index -= header_.num_vars;
      int num_linear_terms = reader_.ReadUInt();
      int position = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      typename Handler::LinearExprHandler
          expr_handler(handler_.BeginCommonExpr(expr_index, num_linear_terms));
      if (num_linear_terms != 0)
        ReadLinearExpr(num_linear_terms, expr_handler);
      handler_.EndCommonExpr(expr_index, ReadNumericExpr(), position);
      break;
    }
    case 'F': {
      // Imported function description.
      int index = ReadUInt(header_.num_funcs);
      int type = reader_.ReadUInt();
      if (type != func::NUMERIC && type != func::SYMBOLIC)
        reader_.ReportError("invalid function type");
      int num_args = reader_.template ReadInt<int>();
      fmt::StringRef name = reader_.ReadName();
      reader_.ReadTillEndOfLine();
      handler_.OnFunction(index, name, num_args, static_cast<func::Type>(type));
      break;
    }
    case 'G':
      // Linear part of an objective expression & gradient sparsity.
      ReadLinearExpr<ObjHandler>();
      break;
    case 'J':
      // Jacobian sparsity & linear terms in constraints.
      ReadLinearExpr<AlgebraicConHandler>();
      break;
    case 'S': {
      // Suffix values.
      int info = reader_.ReadUInt();
      if (info > (internal::SUFFIX_KIND_MASK | suf::FLOAT))
        reader_.ReportError("invalid suffix kind");
      switch (info & internal::SUFFIX_KIND_MASK) {
      case suf::VAR:
        ReadSuffix<VarHandler>(info);
        break;
      case suf::CON:
        ReadSuffix<ConHandler>(info);
        break;
      case suf::OBJ:
        ReadSuffix<ObjHandler>(info);
        break;
      case suf::PROBLEM:
        ReadSuffix<ProblemHandler>(info);
        break;
      }
      break;
    }
    case 'b':
      // Bounds on variables.
      if (read_bounds) {
        ReadBounds<VarHandler>();
        reader_.ptr();
        if ((flags_ & READ_BOUNDS_FIRST) != 0)
          return;
        read_bounds = false;
        break;
      }
      if (!bound_reader)
        reader_.ReportError("duplicate 'b' segment");
      reader_ = *bound_reader;
      bound_reader = 0;
      break;
    case 'r':
      // Bounds on algebraic constraint bodies ("ranges").
      ReadBounds<AlgebraicConHandler>();
      break;
    case 'K':
      // Jacobian sparsity & linear constraint term matrix column sizes
      // (must precede all J segments).
      ReadColumnSizes<false>();
      break;
    case 'k':
      // Jacobian sparsity & linear constraint term matrix cumulative column
      // sizes (must precede all J segments).
      ReadColumnSizes<true>();
      break;
    case 'x':
      // Primal initial guess.
      ReadInitialValues<VarHandler>();
      break;
    case 'd':
      // Dual initial guess.
      ReadInitialValues<AlgebraicConHandler>();
      break;
    case '\0':
      if (reader_.IsEOF()) {
        if (read_bounds)
          reader_.ReportError("segment 'b' missing");
        return;
      }
      // Fall through.
    default:
      reader_.ReportError("invalid segment type");
    }
  }
}